

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O3

err_t bakeBSTSRunB(octet *key,bign_params *params,bake_settings *settings,octet *privkeyb,
                  bake_cert *certb,bake_certval_i vala,read_i read,write_i write,void *file)

{
  bool_t bVar1;
  err_t eVar2;
  ulong uVar3;
  size_t sVar4;
  octet *in;
  ulong uVar5;
  blob_t blob;
  octet *in_00;
  ulong uVar6;
  octet *out;
  octet *state;
  size_t len;
  size_t local_58;
  bign_params *local_50;
  bake_certval_i local_48;
  octet *local_40;
  octet *local_38;
  
  local_48 = vala;
  bVar1 = memIsValid(key,0x20);
  if (bVar1 == 0) {
    return 0x6d;
  }
  local_50 = params;
  bVar1 = memIsValid(certb,0x18);
  if (bVar1 == 0) {
    return 0x6d;
  }
  uVar6 = local_50->l;
  if (((uVar6 != 0x80) && (uVar6 != 0x100)) && (uVar6 != 0xc0)) {
    return 0x1f6;
  }
  uVar3 = (uVar6 >> 2) + certb->len + 8;
  uVar5 = uVar6 >> 1;
  if (uVar6 >> 1 <= uVar3) {
    uVar5 = uVar3;
  }
  sVar4 = bignStart_keep(uVar6,bakeBSTS_deep);
  in = (octet *)blobCreate((uVar6 + 0x1f & 0x7fffffffffffffe0) + sVar4 + uVar5 + 0x440);
  if (in == (octet *)0x0) {
    return 0x6e;
  }
  uVar6 = local_50->l >> 1;
  uVar5 = (local_50->l >> 2) + certb->len + 8;
  if (uVar6 <= uVar5) {
    uVar6 = uVar5;
  }
  state = in + uVar6 + 0x200;
  local_38 = key;
  eVar2 = bakeBSTSStart(state,local_50,settings,privkeyb,certb);
  if (eVar2 == 0) {
    out = in + 0x200;
    eVar2 = bakeBSTSStep2(out,state);
    if ((eVar2 == 0) && (eVar2 = (*write)(&local_58,out,local_50->l >> 1,file), eVar2 == 0)) {
      eVar2 = (*read)(&local_58,in,0x200,file);
      if (eVar2 == 0xffffffff) {
        eVar2 = bakeBSTSStep4(out,in,local_58,local_48,state);
        if (eVar2 != 0) goto LAB_0012032b;
        eVar2 = (*write)(&local_58,out,certb->len + (local_50->l >> 2) + 8,file);
      }
      else {
        if (eVar2 != 0) goto LAB_0012032b;
        blob = (blob_t)0x0;
        local_40 = state;
        while (eVar2 == 0) {
          sVar4 = blobSize(blob);
          blob = blobResize(blob,sVar4 + local_58);
          if (blob == (blob_t)0x0) goto LAB_001204e1;
          sVar4 = blobSize(blob);
          memCopy((void *)((long)blob + (sVar4 - local_58)),in,local_58);
          eVar2 = (*read)(&local_58,in,0x200,file);
        }
        if (eVar2 != 0xffffffff) {
          blobClose(blob);
          goto LAB_0012032b;
        }
        sVar4 = blobSize(blob);
        in_00 = (octet *)blobResize(blob,sVar4 + local_58);
        if (in_00 == (octet *)0x0) {
LAB_001204e1:
          blobClose(in);
          return 0x6e;
        }
        sVar4 = blobSize(in_00);
        memCopy(in_00 + (sVar4 - local_58),in,local_58);
        sVar4 = blobSize(in_00);
        state = local_40;
        eVar2 = bakeBSTSStep4(out,in_00,sVar4,local_48,local_40);
        blobClose(in_00);
        if (eVar2 != 0) goto LAB_0012032b;
        eVar2 = (*write)(&local_58,out,certb->len + (local_50->l >> 2) + 8,file);
      }
      if (eVar2 == 0) {
        eVar2 = bakeBSTSStepG(local_38,state);
      }
    }
  }
LAB_0012032b:
  blobClose(in);
  return eVar2;
}

Assistant:

err_t bakeBSTSRunB(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeyb[],
	const bake_cert* certb, bake_certval_i vala,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [512] */
	octet* out;			/* [MAX2(l / 2, l / 4 + certb->len + 8)] */
	void* state;		/* [bakeBSTS_keep()] */
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(certb, sizeof(bake_cert)))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(512 +
		MAX2(params->l / 2, params->l / 4 + certb->len + 8) +
		bakeBSTS_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + 512;
	state = out + MAX2(params->l / 2, params->l / 4 + certb->len + 8);
	// старт
	code = bakeBSTSStart(state, params, settings, privkeyb, certb);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 2
	code = bakeBSTSStep2(out, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 4: прочитать блок M2
	code = read(&len, in, 512, file);
	// шаг 4: M2 из одного блока?
	if (code == ERR_MAX)
	{
		code = bakeBSTSStep4(out, in, len, vala, state);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// шаг 4: ошибка при чтении
	else if (code != ERR_OK)
	{
		blobClose(blob);
		return code;
	}
	// шаг 4: обработать M2 из нескольких блоков
	else
	{
		blob_t M2 = 0;
		while (code == ERR_OK)
		{
			if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
			{
				blobClose(blob);
				return ERR_OUTOFMEMORY;
			}
			memCopy((octet*)M2 + blobSize(M2) - len, in, len);
			code = read(&len, in, 512, file);
		}
		if (code != ERR_MAX)
		{
			blobClose(M2);
			blobClose(blob);
			return code;
		}
		if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
		{
			blobClose(blob);
			return ERR_OUTOFMEMORY;
		}
		memCopy((octet*)M2 + blobSize(M2) - len, in, len);
		code = bakeBSTSStep4(out, M2, blobSize(M2), vala, state);
		blobClose(M2);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBSTSStepG(key, state);
	blobClose(blob);
	return code;
}